

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O1

ScalarFunction * duckdb::CurrvalFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe74;
  FunctionNullHandling in_stack_fffffffffffffe80;
  allocator_type local_179;
  code *bind_lambda;
  LogicalType local_150;
  LogicalType local_138;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_120;
  string local_108;
  LogicalType local_e8;
  BaseScalarFunction local_d0;
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"currval","");
  LogicalType::LogicalType(&local_138,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_138;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_120,__l,&local_179);
  LogicalType::LogicalType(&local_150,BIGINT);
  bind_lambda = NextValFunction<duckdb::CurrentSequenceValueOperator>;
  LogicalType::LogicalType(&local_e8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_e8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffe6c;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffe74;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_108,(vector<duckdb::LogicalType,_true> *)&local_120,&local_150,
             (scalar_function_t *)&stack0xfffffffffffffe88,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffe80,bind_lambda);
  LogicalType::~LogicalType(&local_e8);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xfffffffffffffe88,(_Any_data *)&stack0xfffffffffffffe88,
               __destroy_functor);
  LogicalType::~LogicalType(&local_150);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_120);
  LogicalType::~LogicalType(&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  in_RDI->bind_extended = NextValBind;
  (in_RDI->super_BaseScalarFunction).stability = VOLATILE;
  in_RDI->serialize = duckdb::Serialize;
  in_RDI->deserialize = duckdb::Deserialize;
  in_RDI->init_local_state = NextValLocalFunction;
  BaseScalarFunction::SetReturnsError(&local_d0,&in_RDI->super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_d0);
  return in_RDI;
}

Assistant:

ScalarFunction CurrvalFun::GetFunction() {
	ScalarFunction curr_val("currval", {LogicalType::VARCHAR}, LogicalType::BIGINT,
	                        NextValFunction<CurrentSequenceValueOperator>, nullptr, nullptr);
	curr_val.bind_extended = NextValBind;
	curr_val.stability = FunctionStability::VOLATILE;
	curr_val.serialize = Serialize;
	curr_val.deserialize = Deserialize;
	curr_val.init_local_state = NextValLocalFunction;
	BaseScalarFunction::SetReturnsError(curr_val);
	return curr_val;
}